

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator::ImmutableMapFieldLiteGenerator
          (ImmutableMapFieldLiteGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          Context *context)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char cVar5;
  long lVar6;
  size_type sVar7;
  pointer pcVar8;
  long lVar9;
  undefined8 uVar10;
  bool bVar11;
  JavaType JVar12;
  ClassNameResolver *pCVar13;
  FieldGeneratorInfo *info;
  FieldDescriptor *field;
  Descriptor *pDVar14;
  mapped_type *pmVar15;
  LogMessage *pLVar16;
  FieldDescriptor *pFVar17;
  long *plVar18;
  undefined8 *puVar19;
  bool immutable;
  char *pcVar20;
  long *plVar21;
  size_type *psVar22;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  _Alloc_hider _Var23;
  ClassNameResolver *in_R8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type __dnew;
  size_type __dnew_1;
  size_type __dnew_3;
  string local_160;
  key_type local_140;
  FieldDescriptor *local_120;
  FieldDescriptor *local_118;
  key_type local_110;
  key_type local_f0;
  JavaType local_d0;
  JavaType local_cc;
  ImmutableMapFieldLiteGenerator *local_c8;
  key_type local_c0;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90 [2];
  undefined1 local_68 [56];
  
  (this->super_ImmutableFieldLiteGenerator)._vptr_ImmutableFieldLiteGenerator =
       (_func_int **)&PTR__ImmutableMapFieldLiteGenerator_004df738;
  this->descriptor_ = descriptor;
  variables = &this->variables_;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->context_ = context;
  local_118 = descriptor;
  local_c8 = this;
  pCVar13 = Context::GetNameResolver(context);
  local_c8->name_resolver_ = pCVar13;
  info = Context::GetFieldGeneratorInfo(context,local_118);
  SetCommonFieldVariables(local_118,info,variables);
  field = (FieldDescriptor *)Context::GetNameResolver(context);
  pDVar14 = FieldDescriptor::message_type(local_118);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_68,(ClassNameResolver *)field,pDVar14,true);
  local_90[0]._M_allocated_capacity._0_4_ = 0x65707974;
  local_a0._8_8_ = (char *)0x4;
  local_90[0]._M_local_buf[4] = '\0';
  local_a0._0_8_ = (FieldDescriptor *)(local_a0 + 0x10);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_a0);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)local_68);
  pFVar17 = local_118;
  if ((FieldDescriptor *)local_a0._0_8_ != (FieldDescriptor *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_);
  }
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_);
  }
  if (*(once_flag **)(pFVar17 + 0x18) != (once_flag *)0x0) {
    local_68._0_8_ = FieldDescriptor::TypeOnceInit;
    local_a0._0_8_ = pFVar17;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar17 + 0x18),(_func_void_FieldDescriptor_ptr **)local_68,
               (FieldDescriptor **)local_a0);
    pFVar17 = local_118;
  }
  if (pFVar17[2] != (FieldDescriptor)0xb) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field_lite.cc"
               ,0x31);
    pLVar16 = internal::LogMessage::operator<<
                        ((LogMessage *)local_68,
                         "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (descriptor->type()): ");
    internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar16);
    pFVar17 = local_118;
    internal::LogMessage::~LogMessage((LogMessage *)local_68);
  }
  pDVar14 = FieldDescriptor::message_type(pFVar17);
  if (*(char *)(*(long *)(pDVar14 + 0x20) + 0x4b) == '\0') {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field_lite.cc"
               ,0x33);
    pLVar16 = internal::LogMessage::operator<<
                        ((LogMessage *)local_a0,"CHECK failed: message->options().map_entry(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_160,pLVar16);
    internal::LogMessage::~LogMessage((LogMessage *)local_a0);
  }
  paVar24 = &local_160.field_2;
  local_160.field_2._M_allocated_capacity._0_4_ = 0x79656b;
  local_160._M_string_length = 3;
  local_160._M_dataplus._M_p = (pointer)paVar24;
  pFVar17 = Descriptor::FindFieldByName(pDVar14,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar24) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  local_120 = anon_unknown_1::ValueField(local_118);
  local_cc = GetJavaType(pFVar17);
  local_d0 = GetJavaType(local_120);
  (anonymous_namespace)::TypeName_abi_cxx11_
            (&local_160,(_anonymous_namespace_ *)pFVar17,field,(ClassNameResolver *)0x0,
             SUB81(in_R8,0));
  local_140.field_2._M_allocated_capacity._0_5_ = 0x745f79656b;
  local_140.field_2._M_local_buf[5] = 'y';
  local_140.field_2._M_local_buf[6] = 'p';
  local_140.field_2._M_local_buf[7] = 'e';
  local_140._M_string_length = 8;
  local_140.field_2._M_local_buf[8] = '\0';
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_140);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar24) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  pCVar13 = (ClassNameResolver *)0x1;
  (anonymous_namespace)::TypeName_abi_cxx11_
            (&local_160,(_anonymous_namespace_ *)pFVar17,field,(ClassNameResolver *)0x1,
             SUB81(in_R8,0));
  local_140.field_2._M_allocated_capacity._0_5_ = 0x6465786f62;
  local_140.field_2._M_local_buf[5] = '_';
  local_140.field_2._M_local_buf[6] = 'k';
  local_140.field_2._M_local_buf[7] = 'e';
  local_140.field_2._M_local_buf[8] = 'y';
  local_140.field_2._M_local_buf[9] = '_';
  local_140.field_2._M_local_buf[10] = 't';
  local_140.field_2._M_local_buf[0xb] = 'y';
  local_140.field_2._M_local_buf[0xc] = 'p';
  local_140.field_2._M_local_buf[0xd] = 'e';
  local_140._M_string_length = 0xe;
  local_140.field_2._M_local_buf[0xe] = '\0';
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_140);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar24) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  (anonymous_namespace)::KotlinTypeName_abi_cxx11_
            (&local_160,(_anonymous_namespace_ *)pFVar17,field,pCVar13);
  local_140.field_2._M_allocated_capacity._0_5_ = 0x656b5f746b;
  local_140.field_2._M_local_buf[5] = 'y';
  local_140.field_2._M_local_buf[6] = '_';
  local_140.field_2._M_local_buf[7] = 't';
  local_140.field_2._M_local_buf[8] = 'y';
  local_140.field_2._M_local_buf[9] = 'p';
  local_140.field_2._M_local_buf[10] = 'e';
  local_140._M_string_length = 0xb;
  local_140.field_2._M_local_buf[0xb] = '\0';
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_140);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar24) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  (anonymous_namespace)::KotlinTypeName_abi_cxx11_
            (&local_160,(_anonymous_namespace_ *)local_120,field,pCVar13);
  local_140.field_2._M_allocated_capacity._0_5_ = 0x61765f746b;
  local_140.field_2._M_local_buf[5] = 'l';
  local_140.field_2._M_local_buf[6] = 'u';
  local_140.field_2._M_local_buf[7] = 'e';
  local_140.field_2._M_local_buf[8] = '_';
  local_140.field_2._M_local_buf[9] = 't';
  local_140.field_2._M_local_buf[10] = 'y';
  local_140.field_2._M_local_buf[0xb] = 'p';
  local_140.field_2._M_local_buf[0xc] = 'e';
  local_140._M_string_length = 0xd;
  local_140.field_2._M_local_buf[0xd] = '\0';
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_140);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
  field_00 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
    field_00 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar24) {
    operator_delete(local_160._M_dataplus._M_p);
    field_00 = extraout_RDX_01;
  }
  (anonymous_namespace)::WireType_abi_cxx11_(&local_160,(_anonymous_namespace_ *)pFVar17,field_00);
  local_140.field_2._M_allocated_capacity._0_5_ = 0x775f79656b;
  local_140.field_2._M_local_buf[5] = 'i';
  local_140.field_2._M_local_buf[6] = 'r';
  local_140.field_2._M_local_buf[7] = 'e';
  local_140.field_2._M_local_buf[8] = '_';
  local_140.field_2._M_local_buf[9] = 't';
  local_140.field_2._M_local_buf[10] = 'y';
  local_140.field_2._M_local_buf[0xb] = 'p';
  local_140.field_2._M_local_buf[0xc] = 'e';
  local_140._M_string_length = 0xd;
  local_140.field_2._M_local_buf[0xd] = '\0';
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_140);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar24) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  immutable = SUB81(field,0);
  DefaultValue_abi_cxx11_(&local_160,(java *)pFVar17,(FieldDescriptor *)0x1,immutable,in_R8);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"key_default_value","");
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_140);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar24) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  bVar11 = IsReferenceType(local_cc);
  local_160.field_2._M_allocated_capacity._0_4_ = 0x5f79656b;
  local_160.field_2._M_allocated_capacity._4_2_ = 0x756e;
  local_160.field_2._M_local_buf[6] = 'l';
  local_160.field_2._M_local_buf[7] = 'l';
  local_160.field_2._8_2_ = 0x635f;
  local_160.field_2._M_local_buf[10] = 'h';
  local_160.field_2._M_local_buf[0xb] = 'e';
  local_160.field_2._12_2_ = 0x6b63;
  local_160._M_string_length = 0xe;
  local_160.field_2._M_local_buf[0xe] = '\0';
  local_160._M_dataplus._M_p = (pointer)paVar24;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_160);
  pcVar20 = "java.lang.Class<?> keyClass = key.getClass();";
  if (!bVar11) {
    pcVar20 = "";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,(ulong)pcVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar24) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  bVar11 = IsReferenceType(local_d0);
  pcVar20 = "java.lang.Class<?> valueClass = value.getClass();";
  if (!bVar11) {
    pcVar20 = "";
  }
  local_160._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"value_null_check","");
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_160);
  pCVar13 = (ClassNameResolver *)0x31;
  if (!bVar11) {
    pCVar13 = (ClassNameResolver *)0x0;
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,(ulong)pcVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar24) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  JVar12 = GetJavaType(local_120);
  if (JVar12 == JAVATYPE_ENUM) {
    paVar2 = &local_160.field_2;
    local_160.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
    local_160.field_2._M_allocated_capacity._4_2_ = 0x5f65;
    local_160.field_2._M_local_buf[6] = 't';
    local_160.field_2._M_local_buf[7] = 'y';
    local_160.field_2._8_2_ = 0x6570;
    local_160._M_string_length = 10;
    local_160.field_2._M_local_buf[10] = '\0';
    local_160._M_dataplus._M_p = (pointer)paVar2;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_160);
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x3f0f07);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    local_140._M_dataplus._M_p = (pointer)0x10;
    local_160._M_dataplus._M_p = (pointer)paVar2;
    local_160._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_160,(ulong)&local_140);
    local_160.field_2._M_allocated_capacity._0_4_ = SUB84(local_140._M_dataplus._M_p,0);
    local_160.field_2._M_allocated_capacity._4_2_ =
         (undefined2)((ulong)local_140._M_dataplus._M_p >> 0x20);
    local_160.field_2._M_local_buf[6] = (char)((ulong)local_140._M_dataplus._M_p >> 0x30);
    local_160.field_2._M_local_buf[7] = (char)((ulong)local_140._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_160._M_dataplus._M_p,"boxed_value_type",0x10);
    local_160._M_string_length = (size_type)local_140._M_dataplus._M_p;
    local_160._M_dataplus._M_p[(long)local_140._M_dataplus._M_p] = '\0';
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_160);
    pCVar13 = (ClassNameResolver *)0x11;
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x3e9d2d);
    pFVar17 = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p);
      pFVar17 = extraout_RDX_03;
    }
    (anonymous_namespace)::WireType_abi_cxx11_
              (&local_160,(_anonymous_namespace_ *)local_120,pFVar17);
    local_140.field_2._M_allocated_capacity._0_5_ = 0x65756c6176;
    local_140.field_2._M_local_buf[5] = '_';
    local_140.field_2._M_local_buf[6] = 'w';
    local_140.field_2._M_local_buf[7] = 'i';
    local_140.field_2._M_local_buf[8] = 'r';
    local_140.field_2._M_local_buf[9] = 'e';
    local_140.field_2._M_local_buf[10] = '_';
    local_140.field_2._M_local_buf[0xb] = 't';
    local_140.field_2._M_local_buf[0xc] = 'y';
    local_140.field_2._M_local_buf[0xd] = 'p';
    local_140.field_2._M_local_buf[0xe] = 'e';
    local_140._M_string_length = 0xf;
    local_140.field_2._M_local_buf[0xf] = '\0';
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_140);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    DefaultValue_abi_cxx11_(&local_140,(java *)local_120,(FieldDescriptor *)0x1,immutable,pCVar13);
    plVar18 = (long *)std::__cxx11::string::append((char *)&local_140);
    plVar21 = plVar18 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar21) {
      lVar6 = *plVar21;
      lVar9 = plVar18[3];
      local_160.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar6;
      local_160.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)lVar6 >> 0x20);
      local_160.field_2._M_local_buf[6] = (char)((ulong)lVar6 >> 0x30);
      local_160.field_2._M_local_buf[7] = (char)((ulong)lVar6 >> 0x38);
      local_160.field_2._8_2_ = (undefined2)lVar9;
      local_160.field_2._M_local_buf[10] = (char)((ulong)lVar9 >> 0x10);
      local_160.field_2._M_local_buf[0xb] = (char)((ulong)lVar9 >> 0x18);
      local_160.field_2._12_2_ = (undefined2)((ulong)lVar9 >> 0x20);
      local_160.field_2._M_local_buf[0xe] = (char)((ulong)lVar9 >> 0x30);
      local_160.field_2._M_local_buf[0xf] = (char)((ulong)lVar9 >> 0x38);
      local_160._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      lVar6 = *plVar21;
      local_160.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar6;
      local_160.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)lVar6 >> 0x20);
      local_160.field_2._M_local_buf[6] = (char)((ulong)lVar6 >> 0x30);
      local_160.field_2._M_local_buf[7] = (char)((ulong)lVar6 >> 0x38);
      local_160._M_dataplus._M_p = (pointer)*plVar18;
    }
    local_160._M_string_length = plVar18[1];
    *plVar18 = (long)plVar21;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_f0._M_dataplus._M_p = (pointer)0x13;
    local_110._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_f0);
    local_110.field_2._M_allocated_capacity._0_4_ = SUB84(local_f0._M_dataplus._M_p,0);
    local_110.field_2._M_local_buf[4] = (char)((ulong)local_f0._M_dataplus._M_p >> 0x20);
    local_110.field_2._M_local_buf[5] = (char)((ulong)local_f0._M_dataplus._M_p >> 0x28);
    local_110.field_2._M_allocated_capacity._6_2_ =
         (undefined2)((ulong)local_f0._M_dataplus._M_p >> 0x30);
    builtin_strncpy(local_110._M_dataplus._M_p,"value_default_value",0x13);
    local_110._M_string_length = (size_type)local_f0._M_dataplus._M_p;
    local_110._M_dataplus._M_p[(long)local_f0._M_dataplus._M_p] = '\0';
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_110);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&local_160,(_anonymous_namespace_ *)local_120,field,(ClassNameResolver *)0x0,
               SUB81(pCVar13,0));
    local_140.field_2._M_allocated_capacity._0_5_ = 0x65756c6176;
    local_140.field_2._M_local_buf[5] = '_';
    local_140.field_2._M_local_buf[6] = 'e';
    local_140.field_2._M_local_buf[7] = 'n';
    local_140.field_2._M_local_buf[8] = 'u';
    local_140.field_2._M_local_buf[9] = 'm';
    local_140.field_2._M_local_buf[10] = '_';
    local_140.field_2._M_local_buf[0xb] = 't';
    local_140.field_2._M_local_buf[0xc] = 'y';
    local_140.field_2._M_local_buf[0xd] = 'p';
    local_140.field_2._M_local_buf[0xe] = 'e';
    local_140._M_string_length = 0xf;
    local_140.field_2._M_local_buf[0xf] = '\0';
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_140);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    if (*(char *)(*(long *)(local_118 + 0x10) + 0x3a) == '\x03') {
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      local_140.field_2._M_allocated_capacity._0_5_ = 0x65756c6176;
      local_140.field_2._M_local_buf[5] = '_';
      local_140.field_2._M_local_buf[6] = 'e';
      local_140.field_2._M_local_buf[7] = 'n';
      local_140.field_2._M_local_buf[8] = 'u';
      local_140.field_2._M_local_buf[9] = 'm';
      local_140.field_2._M_local_buf[10] = '_';
      local_140.field_2._M_local_buf[0xb] = 't';
      local_140.field_2._M_local_buf[0xc] = 'y';
      local_140.field_2._M_local_buf[0xd] = 'p';
      local_140.field_2._M_local_buf[0xe] = 'e';
      local_140._M_string_length = 0xf;
      local_140.field_2._M_local_buf[0xf] = '\0';
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,&local_140);
      pcVar8 = (pmVar15->_M_dataplus)._M_p;
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,pcVar8,pcVar8 + pmVar15->_M_string_length);
      std::__cxx11::string::append((char *)&local_160);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      local_f0._M_dataplus._M_p = (pointer)0x12;
      local_110._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_f0);
      local_110.field_2._M_allocated_capacity._0_4_ = SUB84(local_f0._M_dataplus._M_p,0);
      local_110.field_2._M_local_buf[4] = (char)((ulong)local_f0._M_dataplus._M_p >> 0x20);
      local_110.field_2._M_local_buf[5] = (char)((ulong)local_f0._M_dataplus._M_p >> 0x28);
      local_110.field_2._M_allocated_capacity._6_2_ =
           (undefined2)((ulong)local_f0._M_dataplus._M_p >> 0x30);
      builtin_strncpy(local_110._M_dataplus._M_p,"unrecognized_value",0x12);
      local_110._M_string_length = (size_type)local_f0._M_dataplus._M_p;
      local_110._M_dataplus._M_p[(long)local_f0._M_dataplus._M_p] = '\0';
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,&local_110);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      _Var23._M_p = local_140._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p == &local_140.field_2) goto LAB_002f7759;
    }
    else {
      DefaultValue_abi_cxx11_(&local_160,(java *)local_120,(FieldDescriptor *)0x1,immutable,pCVar13)
      ;
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"unrecognized_value","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,&local_140);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      _Var23._M_p = local_160._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p == &local_160.field_2) goto LAB_002f7759;
    }
  }
  else {
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&local_160,(_anonymous_namespace_ *)local_120,field,(ClassNameResolver *)0x0,
               SUB81(pCVar13,0));
    local_140.field_2._M_allocated_capacity._0_5_ = 0x65756c6176;
    local_140.field_2._M_local_buf[5] = '_';
    local_140.field_2._M_local_buf[6] = 't';
    local_140.field_2._M_local_buf[7] = 'y';
    local_140.field_2._M_local_buf[8] = 'p';
    local_140.field_2._M_local_buf[9] = 'e';
    local_140._M_string_length = 10;
    local_140.field_2._M_local_buf[10] = '\0';
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_140);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar24) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&local_160,(_anonymous_namespace_ *)local_120,field,(ClassNameResolver *)0x1,
               SUB81(pCVar13,0));
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"boxed_value_type","");
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_140);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
    pFVar17 = extraout_RDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
      pFVar17 = extraout_RDX_05;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar24) {
      operator_delete(local_160._M_dataplus._M_p);
      pFVar17 = extraout_RDX_06;
    }
    (anonymous_namespace)::WireType_abi_cxx11_
              (&local_160,(_anonymous_namespace_ *)local_120,pFVar17);
    local_140.field_2._M_allocated_capacity._0_5_ = 0x65756c6176;
    local_140.field_2._M_local_buf[5] = '_';
    local_140.field_2._M_local_buf[6] = 'w';
    local_140.field_2._M_local_buf[7] = 'i';
    local_140.field_2._M_local_buf[8] = 'r';
    local_140.field_2._M_local_buf[9] = 'e';
    local_140.field_2._M_local_buf[10] = '_';
    local_140.field_2._M_local_buf[0xb] = 't';
    local_140.field_2._M_local_buf[0xc] = 'y';
    local_140.field_2._M_local_buf[0xd] = 'p';
    local_140.field_2._M_local_buf[0xe] = 'e';
    local_140._M_string_length = 0xf;
    local_140.field_2._M_local_buf[0xf] = '\0';
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_140);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar24) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    DefaultValue_abi_cxx11_(&local_160,(java *)local_120,(FieldDescriptor *)0x1,immutable,pCVar13);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"value_default_value","");
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_140);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    _Var23._M_p = local_160._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p == paVar24) goto LAB_002f7759;
  }
  operator_delete(_Var23._M_p);
LAB_002f7759:
  paVar2 = &local_110.field_2;
  local_110.field_2._M_allocated_capacity._0_4_ = 0x65786f62;
  local_110.field_2._M_local_buf[4] = 'd';
  local_110.field_2._M_local_buf[5] = '_';
  local_110.field_2._M_allocated_capacity._6_2_ = 0x656b;
  local_110.field_2._8_6_ = 0x657079745f79;
  local_110._M_string_length = 0xe;
  local_110.field_2._M_local_buf[0xe] = '\0';
  local_110._M_dataplus._M_p = (pointer)paVar2;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_110);
  pcVar8 = (pmVar15->_M_dataplus)._M_p;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,pcVar8,pcVar8 + pmVar15->_M_string_length);
  std::__cxx11::string::append((char *)&local_140);
  paVar3 = &local_f0.field_2;
  local_c0._M_dataplus._M_p = (pointer)0x10;
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  local_f0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_f0,(ulong)&local_c0);
  local_f0.field_2._M_allocated_capacity._0_6_ = SUB86(local_c0._M_dataplus._M_p,0);
  local_f0.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_c0._M_dataplus._M_p >> 0x30);
  builtin_strncpy(local_f0._M_dataplus._M_p,"boxed_value_type",0x10);
  local_f0._M_string_length = (size_type)local_c0._M_dataplus._M_p;
  local_f0._M_dataplus._M_p[(long)local_c0._M_dataplus._M_p] = '\0';
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_f0);
  plVar18 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_140,(ulong)(pmVar15->_M_dataplus)._M_p);
  plVar21 = plVar18 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar18 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar21) {
    lVar6 = *plVar21;
    lVar9 = plVar18[3];
    local_160.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar6;
    local_160.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)lVar6 >> 0x20);
    local_160.field_2._M_local_buf[6] = (char)((ulong)lVar6 >> 0x30);
    local_160.field_2._M_local_buf[7] = (char)((ulong)lVar6 >> 0x38);
    local_160.field_2._8_2_ = (undefined2)lVar9;
    local_160.field_2._M_local_buf[10] = (char)((ulong)lVar9 >> 0x10);
    local_160.field_2._M_local_buf[0xb] = (char)((ulong)lVar9 >> 0x18);
    local_160.field_2._12_2_ = (undefined2)((ulong)lVar9 >> 0x20);
    local_160.field_2._M_local_buf[0xe] = (char)((ulong)lVar9 >> 0x30);
    local_160.field_2._M_local_buf[0xf] = (char)((ulong)lVar9 >> 0x38);
    local_160._M_dataplus._M_p = (pointer)paVar24;
  }
  else {
    lVar6 = *plVar21;
    local_160.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar6;
    local_160.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)lVar6 >> 0x20);
    local_160.field_2._M_local_buf[6] = (char)((ulong)lVar6 >> 0x30);
    local_160.field_2._M_local_buf[7] = (char)((ulong)lVar6 >> 0x38);
    local_160._M_dataplus._M_p = (pointer)*plVar18;
  }
  local_160._M_string_length = plVar18[1];
  *plVar18 = (long)plVar21;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  paVar4 = &local_c0.field_2;
  local_c0.field_2._M_allocated_capacity._0_5_ = 0x5f65707974;
  local_c0.field_2._M_allocated_capacity._5_2_ = 0x6170;
  local_c0.field_2._M_local_buf[7] = 'r';
  local_c0.field_2._8_5_ = 0x6574656d61;
  local_c0.field_2._M_local_buf[0xd] = 'r';
  local_c0.field_2._M_local_buf[0xe] = 's';
  local_c0._M_string_length = 0xf;
  local_c0.field_2._M_local_buf[0xf] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar4;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar4) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar24) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  cVar5 = *(char *)(*(long *)(local_118 + 0x38) + 0x4e);
  local_160.field_2._M_allocated_capacity._0_4_ = 0x72706564;
  local_160.field_2._M_allocated_capacity._4_2_ = 0x6365;
  local_160.field_2._M_local_buf[6] = 'a';
  local_160.field_2._M_local_buf[7] = 't';
  local_160.field_2._8_2_ = 0x6f69;
  local_160.field_2._M_local_buf[10] = 'n';
  local_160._M_string_length = 0xb;
  local_160.field_2._M_local_buf[0xb] = '\0';
  local_160._M_dataplus._M_p = (pointer)paVar24;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_160);
  pcVar20 = "";
  if (cVar5 != '\0') {
    pcVar20 = "@java.lang.Deprecated ";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,(ulong)pcVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar24) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  cVar5 = *(char *)(*(long *)(local_118 + 0x38) + 0x4e);
  if (cVar5 == '\x01') {
    local_110.field_2._M_allocated_capacity._0_4_ = 0x656d616e;
    local_110._M_string_length = 4;
    local_110.field_2._M_local_buf[4] = '\0';
    local_110._M_dataplus._M_p = (pointer)paVar2;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_110);
    std::operator+(&local_140,"@kotlin.Deprecated(message = \"Field ",pmVar15);
    puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar19 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar19 == paVar24) {
      sVar7 = paVar24->_M_allocated_capacity;
      uVar10 = puVar19[3];
      local_160.field_2._M_allocated_capacity._0_4_ = (undefined4)sVar7;
      local_160.field_2._M_allocated_capacity._4_2_ = (undefined2)(sVar7 >> 0x20);
      local_160.field_2._M_local_buf[6] = (char)(sVar7 >> 0x30);
      local_160.field_2._M_local_buf[7] = (char)(sVar7 >> 0x38);
      local_160.field_2._8_2_ = (undefined2)uVar10;
      local_160.field_2._M_local_buf[10] = (char)((ulong)uVar10 >> 0x10);
      local_160.field_2._M_local_buf[0xb] = (char)((ulong)uVar10 >> 0x18);
      local_160.field_2._12_2_ = (undefined2)((ulong)uVar10 >> 0x20);
      local_160.field_2._M_local_buf[0xe] = (char)((ulong)uVar10 >> 0x30);
      local_160.field_2._M_local_buf[0xf] = (char)((ulong)uVar10 >> 0x38);
    }
    else {
      sVar7 = paVar24->_M_allocated_capacity;
      local_160.field_2._M_allocated_capacity._0_4_ = (undefined4)sVar7;
      local_160.field_2._M_allocated_capacity._4_2_ = (undefined2)(sVar7 >> 0x20);
      local_160.field_2._M_local_buf[6] = (char)(sVar7 >> 0x30);
      local_160.field_2._M_local_buf[7] = (char)(sVar7 >> 0x38);
      local_160._M_dataplus._M_p = (pointer)*puVar19;
    }
    psVar22 = puVar19 + 1;
    local_160._M_string_length = puVar19[1];
    *puVar19 = paVar24;
  }
  else {
    psVar22 = &local_160._M_string_length;
    local_160._M_dataplus._M_p = (pointer)paVar24;
  }
  *psVar22 = 0;
  paVar24->_M_local_buf[0] = '\0';
  local_f0.field_2._M_allocated_capacity._0_6_ = 0x7065645f746b;
  local_f0.field_2._M_allocated_capacity._6_2_ = 0x6572;
  local_f0.field_2._8_6_ = 0x6e6f69746163;
  local_f0._M_string_length = 0xe;
  local_f0.field_2._M_local_buf[0xe] = '\0';
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_f0);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  paVar24 = &local_160.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar24) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if (cVar5 != '\0') {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  local_c0._M_dataplus._M_p = (pointer)0x10;
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  local_f0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_f0,(ulong)&local_c0);
  local_f0.field_2._M_allocated_capacity._0_6_ = SUB86(local_c0._M_dataplus._M_p,0);
  local_f0.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_c0._M_dataplus._M_p >> 0x30);
  builtin_strncpy(local_f0._M_dataplus._M_p,"capitalized_name",0x10);
  local_f0._M_string_length = (size_type)local_c0._M_dataplus._M_p;
  local_f0._M_dataplus._M_p[(long)local_c0._M_dataplus._M_p] = '\0';
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_f0);
  pcVar8 = (pmVar15->_M_dataplus)._M_p;
  local_160._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,pcVar8,pcVar8 + pmVar15->_M_string_length);
  std::__cxx11::string::append((char *)&local_160);
  local_c0.field_2._M_allocated_capacity._0_5_ = 0x7561666564;
  local_c0.field_2._M_allocated_capacity._5_2_ = 0x746c;
  local_c0.field_2._M_local_buf[7] = '_';
  local_c0.field_2._8_5_ = 0x7972746e65;
  local_c0._M_string_length = 0xd;
  local_c0.field_2._M_local_buf[0xd] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar4;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar4) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar24) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

ImmutableMapFieldLiteGenerator::ImmutableMapFieldLiteGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, Context* context)
    : descriptor_(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()) {
  SetMessageVariables(descriptor, messageBitIndex, 0,
                      context->GetFieldGeneratorInfo(descriptor), context,
                      &variables_);
}